

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::TryBindLambdaOrJson
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *function,
          idx_t depth,CatalogEntry *func)

{
  BindResult json_bind_result;
  BindResult lambda_bind_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  BindResult local_140;
  BindResult local_b8;
  
  (*this->_vptr_ExpressionBinder[9])(&local_b8,this,function,func,depth);
  if (local_b8.error.initialized == false) {
    BindResult::BindResult(__return_storage_ptr__,&local_b8);
  }
  else {
    (*this->_vptr_ExpressionBinder[8])(&local_140,this,function,func,depth);
    if (local_140.error.initialized == false) {
      BindResult::BindResult(__return_storage_ptr__,&local_140);
    }
    else {
      ::std::operator+(&local_1a0,"failed to bind function, either: ",&local_b8.error.raw_message);
      ::std::operator+(&local_180,&local_1a0,"\n or: ");
      ::std::operator+(&local_160,&local_180,&local_140.error.raw_message);
      BindResult::BindResult(__return_storage_ptr__,&local_160);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::__cxx11::string::~string((string *)&local_1a0);
    }
    BindResult::~BindResult(&local_140);
  }
  BindResult::~BindResult(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::TryBindLambdaOrJson(FunctionExpression &function, idx_t depth, CatalogEntry &func) {

	auto lambda_bind_result = BindLambdaFunction(function, func.Cast<ScalarFunctionCatalogEntry>(), depth);
	if (!lambda_bind_result.HasError()) {
		return lambda_bind_result;
	}

	auto json_bind_result = BindFunction(function, func.Cast<ScalarFunctionCatalogEntry>(), depth);
	if (!json_bind_result.HasError()) {
		return json_bind_result;
	}

	return BindResult("failed to bind function, either: " + lambda_bind_result.error.RawMessage() +
	                  "\n"
	                  " or: " +
	                  json_bind_result.error.RawMessage());
}